

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_linux.cpp
# Opt level: O2

QString * decodeFsEncString(QString *__return_storage_ptr__,QString *str)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  qsizetype size;
  iterator pQVar4;
  qsizetype qVar5;
  
  size = QString::indexOf(str,(QChar)0x5c,0,CaseSensitive);
  if (size < 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
    pQVar4 = QString::begin(__return_storage_ptr__);
    lVar1 = (__return_storage_ptr__->d).size;
    qVar5 = size;
    while (qVar5 < lVar1) {
      if ((qVar5 < lVar1 + -3) && (pQVar4[qVar5 + 1].ucs == L'x')) {
        iVar2 = QtMiscUtils::fromHex((uint)(ushort)pQVar4[qVar5 + 2].ucs);
        uVar3 = QtMiscUtils::fromHex((uint)(ushort)pQVar4[qVar5 + 3].ucs);
        uVar3 = uVar3 | iVar2 << 4;
        if ((int)uVar3 < 0) {
          uVar3 = 0xfffd;
        }
        pQVar4[size].ucs = (char16_t)uVar3;
        size = size + 1;
        qVar5 = qVar5 + 4;
      }
      for (; (qVar5 < lVar1 && (pQVar4[qVar5].ucs != L'\\')); qVar5 = qVar5 + 1) {
        pQVar4[size].ucs = pQVar4[qVar5].ucs;
        size = size + 1;
      }
    }
    QString::resize(__return_storage_ptr__,size);
  }
  return __return_storage_ptr__;
}

Assistant:

static QString decodeFsEncString(QString &&str)
{
    using namespace QtMiscUtils;
    qsizetype start = str.indexOf(u'\\');
    if (start < 0)
        return std::move(str);

    // decode in-place
    QString decoded = std::move(str);
    auto ptr = reinterpret_cast<char16_t *>(decoded.begin());
    qsizetype in = start;
    qsizetype out = start;
    qsizetype size = decoded.size();

    while (in < size) {
        Q_ASSERT(ptr[in] == u'\\');
        if (size - in >= 4 && ptr[in + 1] == u'x') {    // we need four characters: \xAB
            int c = fromHex(ptr[in + 2]) << 4;
            c |= fromHex(ptr[in + 3]);
            if (Q_UNLIKELY(c < 0))
                c = QChar::ReplacementCharacter;        // bad hex sequence
            ptr[out++] = c;
            in += 4;
        }

        for ( ; in < size; ++in) {
            char16_t c = ptr[in];
            if (c == u'\\')
                break;
            ptr[out++] = c;
        }
    }
    decoded.resize(out);
    return decoded;
}